

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleColsUp2_C(uint8_t *dst_ptr,uint8_t *src_ptr,int dst_width,int x,int dx)

{
  uint8_t uVar1;
  long lVar2;
  
  for (lVar2 = 0; (int)lVar2 < dst_width + -1; lVar2 = lVar2 + 2) {
    uVar1 = *src_ptr;
    dst_ptr[lVar2] = uVar1;
    dst_ptr[lVar2 + 1] = uVar1;
    src_ptr = src_ptr + 1;
  }
  if ((dst_width & 1U) != 0) {
    dst_ptr[lVar2] = *src_ptr;
  }
  return;
}

Assistant:

void ScaleColsUp2_C(uint8_t* dst_ptr,
                    const uint8_t* src_ptr,
                    int dst_width,
                    int x,
                    int dx) {
  int j;
  (void)x;
  (void)dx;
  for (j = 0; j < dst_width - 1; j += 2) {
    dst_ptr[1] = dst_ptr[0] = src_ptr[0];
    src_ptr += 1;
    dst_ptr += 2;
  }
  if (dst_width & 1) {
    dst_ptr[0] = src_ptr[0];
  }
}